

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<std::__cxx11::string> * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::
value_or_eval<__lest_function__1125(lest::env&)::__6>
          (optional<std::__cxx11::string> *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_2)

{
  bool bVar1;
  value_type *pvVar2;
  char *pcVar3;
  allocator local_41;
  string local_40 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  optional<std::__cxx11::string> *local_10;
  
  local_20 = param_2;
  local_10 = this;
  bVar1 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value(param_2);
  if (bVar1) {
    pvVar2 = detail::
             storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&param_2->contained);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
  }
  else {
    pcVar3 = __lest_function__1125::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&this_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar3,&local_41);
    std::__cxx11::string::string((string *)this,local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return this;
}

Assistant:

optional_constexpr14 value_type value_or_eval( F f ) &&
    {
        if ( has_value() )
        {
            return std::move( contained.value() );
        }
        else
        {
            return f();
        }
    }